

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall
QFileSystemModelPrivate::fileSystemChanged
          (QFileSystemModelPrivate *this,QString *path,
          QList<std::pair<QString,_QFileInfo>_> *updates)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QFileSystemModelPrivate *this_00;
  QFileInfoGatherer *pQVar5;
  long lVar6;
  qsizetype qVar7;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  int lastColumn;
  int visibleMax;
  int visibleMin;
  QString *value;
  add_const_t<QList<QString>_> *__range1_1;
  int visibleLocation;
  bool isCaseSensitive;
  bool previouslyHere;
  pair<QString,_QFileInfo> *update;
  QList<std::pair<QString,_QFileInfo>_> *__range1;
  QFileSystemNode *parentNode;
  QFileSystemModel *q;
  QModelIndex bottom;
  QModelIndex top;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QString max;
  QString min;
  QFileSystemNode *node;
  QExtendedInformation info;
  QString fileName;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndex parentIndex;
  QStringList newFiles;
  QList<QString> rowsToUpdate;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  QFileSystemModelPrivate *in_stack_fffffffffffffe10;
  QFileSystemModelPrivate *in_stack_fffffffffffffe18;
  iterator in_stack_fffffffffffffe20;
  QFileSystemModelPrivate *pQVar8;
  iterator in_stack_fffffffffffffe28;
  QFileInfoGatherer *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  QFileSystemNode *in_stack_fffffffffffffe50;
  QFileSystemModelPrivate *in_stack_fffffffffffffe58;
  QFileSystemModelPrivate *pQVar9;
  undefined1 fetch;
  QFileSystemNode *in_stack_fffffffffffffeb8;
  QFileSystemModelPrivate *in_stack_fffffffffffffec0;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  QString *local_100;
  const_iterator local_f8;
  const_iterator local_f0;
  QString local_e8;
  QString local_d0;
  QFileSystemNode *local_b8;
  QFileInfo local_b0 [8];
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  pair<QString,_QFileInfo> *local_68;
  const_iterator local_60;
  const_iterator local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  QList<QString> local_38;
  undefined1 local_20 [16];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = in_RDI;
  this_00 = (QFileSystemModelPrivate *)q_func(in_RDI);
  fetch = (undefined1)((ulong)pQVar9 >> 0x38);
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0xaaa1c8);
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0xaaa202);
  pQVar5 = (QFileInfoGatherer *)
           QFileSystemModelPrivate::node
                     (in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->fileName,(bool)fetch);
  local_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  index((QFileSystemModelPrivate *)local_50,(char *)in_RDI,(int)pQVar5);
  local_58.i = (pair<QString,_QFileInfo> *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = QList<std::pair<QString,_QFileInfo>_>::begin
                       ((QList<std::pair<QString,_QFileInfo>_> *)in_stack_fffffffffffffe10);
  local_60.i = (pair<QString,_QFileInfo> *)&DAT_aaaaaaaaaaaaaaaa;
  local_60 = QList<std::pair<QString,_QFileInfo>_>::end
                       ((QList<std::pair<QString,_QFileInfo>_> *)in_stack_fffffffffffffe10);
  do {
    local_68 = local_60.i;
    bVar1 = QList<std::pair<QString,_QFileInfo>_>::const_iterator::operator!=(&local_58,local_60);
    if (!bVar1) {
      QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffe10);
      QList<QString>::end((QList<QString> *)in_stack_fffffffffffffe10);
      std::sort<QList<QString>::iterator>(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      local_d0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d0.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_d0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0xaaa6ad);
      local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0xaaa6e7);
      pQVar9 = (QFileSystemModelPrivate *)local_20;
      local_f0.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_f0 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffe10);
      local_f8.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffe10);
      while( true ) {
        local_100 = local_f8.i;
        bVar1 = QList<QString>::const_iterator::operator!=(&local_f0,local_f8);
        if (!bVar1) break;
        in_stack_fffffffffffffe50 =
             (QFileSystemNode *)QList<QString>::const_iterator::operator*(&local_f0);
        QString::operator=(&local_e8,(QString *)in_stack_fffffffffffffe50);
        QString::operator=(&local_d0,(QString *)in_stack_fffffffffffffe50);
        in_stack_fffffffffffffe4c =
             QFileSystemNode::visibleLocation
                       ((QFileSystemNode *)in_stack_fffffffffffffe10,
                        (QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        in_stack_fffffffffffffe48 =
             QFileSystemNode::visibleLocation
                       ((QFileSystemNode *)in_stack_fffffffffffffe10,
                        (QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        if (-1 < in_stack_fffffffffffffe4c) {
          lVar6 = (long)in_stack_fffffffffffffe4c;
          qVar7 = QList<QString>::size(&(pQVar5->path).super_QList<QString>);
          if (lVar6 < qVar7) {
            QList<QString>::at((QList<QString> *)in_stack_fffffffffffffe10,
                               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            bVar1 = ::operator==((QString *)in_stack_fffffffffffffe10,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            if ((bVar1) && (-1 < in_stack_fffffffffffffe48)) {
              iVar3 = (**(code **)(*(long *)this_00 + 0x80))(this_00,local_50);
              iVar3 = iVar3 + -1;
              local_118 = &DAT_aaaaaaaaaaaaaaaa;
              local_110 = &DAT_aaaaaaaaaaaaaaaa;
              local_108 = &DAT_aaaaaaaaaaaaaaaa;
              in_stack_fffffffffffffe10 = this_00;
              iVar4 = translateVisibleLocation
                                (in_stack_fffffffffffffe18,(QFileSystemNode *)this_00,
                                 in_stack_fffffffffffffe0c);
              (**(code **)(*(long *)in_stack_fffffffffffffe10 + 0x60))
                        (&local_118,in_stack_fffffffffffffe10,iVar4,0,local_50);
              local_130 = &DAT_aaaaaaaaaaaaaaaa;
              local_128 = &DAT_aaaaaaaaaaaaaaaa;
              local_120 = &DAT_aaaaaaaaaaaaaaaa;
              in_stack_fffffffffffffe18 = this_00;
              iVar4 = translateVisibleLocation
                                (this_00,(QFileSystemNode *)in_stack_fffffffffffffe10,
                                 in_stack_fffffffffffffe0c);
              (**(code **)(*(long *)in_stack_fffffffffffffe18 + 0x60))
                        (&local_130,in_stack_fffffffffffffe18,iVar4,iVar3,local_50);
              pQVar8 = this_00;
              memset(&stack0xfffffffffffffeb8,0,0x18);
              QList<int>::QList((QList<int> *)0xaaa989);
              QAbstractItemModel::dataChanged
                        ((QModelIndex *)pQVar8,(QModelIndex *)&local_118,
                         (QList_conflict3 *)&local_130);
              QList<int>::~QList((QList<int> *)0xaaa9b8);
            }
          }
        }
        QList<QString>::const_iterator::operator++(&local_f0);
      }
      qVar7 = QList<QString>::size(&local_38);
      if (0 < qVar7) {
        addVisibleFiles(pQVar9,in_stack_fffffffffffffe50,
                        (QStringList *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                       );
      }
      qVar7 = QList<QString>::size(&local_38);
      if ((0 < qVar7) ||
         ((in_RDI->sortColumn != 0 &&
          (qVar7 = QList<QString>::size((QList<QString> *)local_20), 0 < qVar7)))) {
        in_RDI->forceSort = true;
        delayedSort(in_stack_fffffffffffffe10);
      }
      QString::~QString((QString *)0xaaaa4b);
      QString::~QString((QString *)0xaaaa58);
      QList<QString>::~QList((QList<QString> *)0xaaaa65);
      QList<QString>::~QList((QList<QString> *)0xaaaa72);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QList<std::pair<QString,_QFileInfo>_>::const_iterator::operator*(&local_58);
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_fffffffffffffe10,
                     (QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    memset(&local_a8,0,0x28);
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::operator->
              ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)0xaaa3de);
    QFileInfoGatherer::getInfo(in_stack_fffffffffffffe30,(QFileInfo *)in_stack_fffffffffffffe28.i);
    bVar1 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::contains
                      ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                       in_stack_fffffffffffffe18,(QString *)in_stack_fffffffffffffe10);
    if (!bVar1) {
      in_stack_fffffffffffffe30 = pQVar5;
      QExtendedInformation::fileInfo
                ((QExtendedInformation *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      addNode((QFileSystemModelPrivate *)
              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
              (QFileSystemNode *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
              (QString *)in_RDI,(QFileInfo *)in_stack_fffffffffffffe30);
      QFileInfo::~QFileInfo(local_b0);
    }
    local_b8 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                         ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                          in_stack_fffffffffffffe18,(QString *)in_stack_fffffffffffffe10);
    bVar1 = QFileSystemNode::caseSensitive
                      ((QFileSystemNode *)
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    if (bVar1) {
      bVar2 = ::operator!=((QString *)in_stack_fffffffffffffe10,
                           (QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
      ;
      if (!bVar2) {
LAB_00aaa4fb:
        if (!bVar1) {
          QString::operator=(&local_b8->fileName,(QString *)&local_80);
        }
        bVar1 = QFileSystemNode::operator!=
                          ((QFileSystemNode *)in_stack_fffffffffffffe10,
                           (QExtendedInformation *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        if (bVar1) {
          QFileSystemNode::populate
                    ((QFileSystemNode *)in_stack_fffffffffffffe20.i,
                     (QExtendedInformation *)in_stack_fffffffffffffe18);
          QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::remove
                    (&in_RDI->bypassFilters,(char *)&local_b8);
          bVar1 = filtersAcceptsNode(in_stack_fffffffffffffe58,in_stack_fffffffffffffeb8);
          if (bVar1) {
            if ((local_b8->isVisible & 1U) == 0) {
              QList<QString>::append
                        ((QList<QString> *)in_stack_fffffffffffffe10,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            }
            else {
              QList<QString>::append
                        ((QList<QString> *)in_stack_fffffffffffffe10,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            }
          }
          else if ((local_b8->isVisible & 1U) != 0) {
            QFileSystemNode::visibleLocation
                      ((QFileSystemNode *)in_stack_fffffffffffffe10,
                       (QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            removeVisibleFile((QFileSystemModelPrivate *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              (QFileSystemNode *)in_RDI,
                              (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
          }
        }
      }
    }
    else {
      iVar3 = QString::compare((QString *)in_stack_fffffffffffffe10,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                               CaseInsensitive);
      if (iVar3 == 0) goto LAB_00aaa4fb;
    }
    QExtendedInformation::~QExtendedInformation((QExtendedInformation *)in_stack_fffffffffffffe10);
    QString::~QString((QString *)0xaaa620);
    QList<std::pair<QString,_QFileInfo>_>::const_iterator::operator++(&local_58);
  } while( true );
}

Assistant:

void QFileSystemModelPrivate::fileSystemChanged(const QString &path,
                                                   const QList<std::pair<QString, QFileInfo>> &updates)
{
#if QT_CONFIG(filesystemwatcher)
    Q_Q(QFileSystemModel);
    QList<QString> rowsToUpdate;
    QStringList newFiles;
    QFileSystemModelPrivate::QFileSystemNode *parentNode = node(path, false);
    QModelIndex parentIndex = index(parentNode);
    for (const auto &update : updates) {
        QString fileName = update.first;
        Q_ASSERT(!fileName.isEmpty());
        QExtendedInformation info = fileInfoGatherer->getInfo(update.second);
        bool previouslyHere = parentNode->children.contains(fileName);
        if (!previouslyHere) {
#ifdef Q_OS_WIN
            chopSpaceAndDot(fileName);
            if (fileName.isEmpty())
                continue;
#endif
            addNode(parentNode, fileName, info.fileInfo());
        }
        QFileSystemModelPrivate::QFileSystemNode * node = parentNode->children.value(fileName);
        bool isCaseSensitive = parentNode->caseSensitive();
        if (isCaseSensitive) {
            if (node->fileName != fileName)
                continue;
        } else {
            if (QString::compare(node->fileName,fileName,Qt::CaseInsensitive) != 0)
                continue;
        }
        if (isCaseSensitive) {
            Q_ASSERT(node->fileName == fileName);
        } else {
            node->fileName = fileName;
        }

        if (*node != info ) {
            node->populate(info);
            bypassFilters.remove(node);
            // brand new information.
            if (filtersAcceptsNode(node)) {
                if (!node->isVisible) {
                    newFiles.append(fileName);
                } else {
                    rowsToUpdate.append(fileName);
                }
            } else {
                if (node->isVisible) {
                    int visibleLocation = parentNode->visibleLocation(fileName);
                    removeVisibleFile(parentNode, visibleLocation);
                } else {
                    // The file is not visible, don't do anything
                }
            }
        }
    }

    // bundle up all of the changed signals into as few as possible.
    std::sort(rowsToUpdate.begin(), rowsToUpdate.end());
    QString min;
    QString max;
    for (const QString &value : std::as_const(rowsToUpdate)) {
        //##TODO is there a way to bundle signals with QString as the content of the list?
        /*if (min.isEmpty()) {
            min = value;
            if (i != rowsToUpdate.count() - 1)
                continue;
        }
        if (i != rowsToUpdate.count() - 1) {
            if ((value == min + 1 && max.isEmpty()) || value == max + 1) {
                max = value;
                continue;
            }
        }*/
        max = value;
        min = value;
        int visibleMin = parentNode->visibleLocation(min);
        int visibleMax = parentNode->visibleLocation(max);
        if (visibleMin >= 0
            && visibleMin < parentNode->visibleChildren.size()
            && parentNode->visibleChildren.at(visibleMin) == min
            && visibleMax >= 0) {
            // don't use NumColumns here, a subclass might override columnCount
            const int lastColumn = q->columnCount(parentIndex) - 1;
            const QModelIndex top = q->index(translateVisibleLocation(parentNode, visibleMin),
                                             QFileSystemModelPrivate::NameColumn, parentIndex);
            const QModelIndex bottom = q->index(translateVisibleLocation(parentNode, visibleMax),
                                                lastColumn, parentIndex);
            // We document that emitting dataChanged with indexes that don't have the
            // same parent is undefined behavior.
            Q_ASSERT(bottom.parent() == top.parent());
            emit q->dataChanged(top, bottom);
        }

        /*min = QString();
        max = QString();*/
    }

    if (newFiles.size() > 0) {
        addVisibleFiles(parentNode, newFiles);
    }

    if (newFiles.size() > 0 || (sortColumn != 0 && rowsToUpdate.size() > 0)) {
        forceSort = true;
        delayedSort();
    }
#else
    Q_UNUSED(path);
    Q_UNUSED(updates);
#endif // filesystemwatcher
}